

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_value_test.cpp
# Opt level: O0

void testSingleValue_MultipleValueArguments_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  string error;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  Argengine ae;
  char *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  anon_class_8_1_70098e60 *in_stack_fffffffffffff918;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff920;
  allocator_type *in_stack_fffffffffffff938;
  allocator<char> *in_stack_fffffffffffff940;
  key_type *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff958;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff960;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff968;
  string *local_5f8;
  string *local_5b8;
  string *local_578;
  string *local_538;
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  string local_440 [39];
  allocator<char> local_419;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [32];
  undefined1 *local_3d0;
  undefined1 local_3c8 [38];
  undefined1 local_3a2;
  allocator<char> local_3a1;
  string *local_3a0;
  string local_398 [32];
  string *local_378;
  undefined8 local_370;
  undefined1 local_368 [55];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  undefined1 *local_2e8;
  undefined1 local_2e0 [38];
  undefined1 local_2ba;
  allocator<char> local_2b9;
  string *local_2b8;
  string local_2b0 [32];
  string *local_290;
  undefined8 local_288;
  undefined1 local_280 [55];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [32];
  undefined1 *local_200;
  undefined1 local_1f8 [38];
  undefined1 local_1d2;
  allocator<char> local_1d1;
  string *local_1d0;
  string local_1c8 [32];
  string *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [48];
  undefined1 local_168 [53];
  undefined1 local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  allocator<char> local_130;
  allocator<char> local_12f;
  allocator<char> local_12e;
  allocator<char> local_12d [20];
  allocator<char> local_119;
  string *local_118;
  string local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_133 = 1;
  local_118 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_118 = (string *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_118 = (string *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_118 = (string *)local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_118 = (string *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_118 = (string *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_118 = (string *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_133 = 0;
  local_30 = local_110;
  local_28 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10da15);
  __l._M_len = (size_type)in_stack_fffffffffffff950;
  __l._M_array = in_stack_fffffffffffff948;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff940,__l,in_stack_fffffffffffff938);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff920);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10da72);
  local_538 = (string *)&local_30;
  do {
    local_538 = local_538 + -0x20;
    std::__cxx11::string::~string(local_538);
  } while (local_538 != local_110);
  std::allocator<char>::~allocator(&local_132);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::~allocator(&local_130);
  std::allocator<char>::~allocator(&local_12f);
  std::allocator<char>::~allocator(&local_12e);
  std::allocator<char>::~allocator(local_12d);
  std::allocator<char>::~allocator(&local_119);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10db2e);
  local_1d2 = 1;
  local_1d0 = local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_1d2 = 0;
  local_1a8 = local_1c8;
  local_1a0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10dbba);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958,
        (allocator_type *)in_stack_fffffffffffff950);
  local_200 = local_168;
  std::function<void(std::__cxx11::string)>::
  function<testSingleValue_MultipleValueArguments_ShouldSucceed()::__0,void>
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  juzzlin::Argengine::addOption(local_8,local_198,local_1f8,0,local_220,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x10dce6);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10dcf3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10dd00);
  local_578 = (string *)&local_1a8;
  do {
    local_578 = local_578 + -0x20;
    std::__cxx11::string::~string(local_578);
  } while (local_578 != local_1c8);
  std::allocator<char>::~allocator(&local_1d1);
  local_2ba = 1;
  local_2b8 = local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_2ba = 0;
  local_290 = local_2b0;
  local_288 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10ddeb);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958,
        (allocator_type *)in_stack_fffffffffffff950);
  local_2e8 = local_168;
  std::function<void(std::__cxx11::string)>::
  function<testSingleValue_MultipleValueArguments_ShouldSucceed()::__1,void>
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  juzzlin::Argengine::addOption(local_8,local_280,local_2e0,0,local_308,local_330);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x10df17);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10df24);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10df31);
  local_5b8 = (string *)&local_290;
  do {
    local_5b8 = local_5b8 + -0x20;
    std::__cxx11::string::~string(local_5b8);
  } while (local_5b8 != local_2b0);
  std::allocator<char>::~allocator(&local_2b9);
  local_3a2 = 1;
  local_3a0 = local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  local_3a2 = 0;
  local_378 = local_398;
  local_370 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10e01c);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff958,
        (allocator_type *)in_stack_fffffffffffff950);
  local_3d0 = local_168;
  std::function<void(std::__cxx11::string)>::
  function<testSingleValue_MultipleValueArguments_ShouldSucceed()::__2,void>
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  juzzlin::Argengine::addOption(local_8,local_368,local_3c8,0,local_3f0,local_418);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x10e148);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10e155);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10e162);
  local_5f8 = (string *)&local_378;
  do {
    local_5f8 = local_5f8 + -0x20;
    std::__cxx11::string::~string(local_5f8);
  } while (local_5f8 != local_398);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::string(local_440);
  juzzlin::Argengine::parse();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff908);
  if (!bVar1) {
    __assert_fail("values[\"a\"] == \"1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp"
                  ,0xbe,"void testSingleValue_MultipleValueArguments_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff908);
  if (!bVar1) {
    __assert_fail("values[\"b\"] == \"2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp"
                  ,0xbf,"void testSingleValue_MultipleValueArguments_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff908);
  if (!bVar1) {
    __assert_fail("values[\"c\"] == \"3\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp"
                  ,0xc0,"void testSingleValue_MultipleValueArguments_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string(local_440);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10eb76);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testSingleValue_MultipleValueArguments_ShouldSucceed()
{
    Argengine ae({ "test", "-a", "1", "-b", "2", "-c", "3" });
    std::map<std::string, std::string> values;
    ae.addOption({ "-a" }, [&](std::string value) {
        values["a"] = value;
    });
    ae.addOption({ "-b" }, [&](std::string value) {
        values["b"] = value;
    });
    ae.addOption({ "-c" }, [&](std::string value) {
        values["c"] = value;
    });
    std::string error;
    ae.parse();
    assert(values["a"] == "1");
    assert(values["b"] == "2");
    assert(values["c"] == "3");
}